

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>::AdvanceIfEnd<3ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  bool bVar1;
  ParamIterator<int> *this_00;
  size_t NextI;
  bool last;
  ParamIterator<unsigned_int> *in_stack_ffffffffffffffc8;
  ParamIterator<unsigned_int> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
              *)0x7a82ec);
  std::
  get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
              *)0x7a82ff);
  bVar1 = ParamIterator<unsigned_int>::operator!=
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = (ParamIterator<int> *)
              std::
              get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>>
                        ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                          *)0x7a8339);
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                *)0x7a834c);
    ParamIterator<unsigned_int>::operator=
              ((ParamIterator<unsigned_int> *)this_00,in_stack_ffffffffffffffc8);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<unsigned_int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                *)0x7a8367);
    ParamIterator<int>::operator++(this_00);
    AdvanceIfEnd<2ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }